

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

CVmVarHeapHybrid_hdr * __thiscall
CVmVarHeapHybrid_head::alloc(CVmVarHeapHybrid_head *this,size_t param_2)

{
  _func_int **pp_Var1;
  CVmVarHeapHybrid_hdr *pCVar2;
  size_t sVar3;
  _func_int *p_Var4;
  CVmVarHeapHybrid_block *in_RDI;
  CVmVarHeapHybrid_hdr *ret;
  size_t cnt;
  char *p;
  size_t real_cell_size;
  CVmVarHeapHybrid_array *arr;
  _func_int **local_30;
  _func_int **local_28;
  
  if (in_RDI[3]._vptr_CVmVarHeapHybrid_block == (_func_int **)0x0) {
    pp_Var1 = in_RDI[1]._vptr_CVmVarHeapHybrid_block;
    sVar3 = osrndsz(8);
    sVar3 = osrndsz((long)pp_Var1 + sVar3);
    p_Var4 = (_func_int *)malloc((long)in_RDI[2]._vptr_CVmVarHeapHybrid_block * sVar3 + 0x10);
    if (p_Var4 == (_func_int *)0x0) {
      err_throw(0);
    }
    *(_func_int **)p_Var4 = in_RDI[4]._vptr_CVmVarHeapHybrid_block[1];
    in_RDI[4]._vptr_CVmVarHeapHybrid_block[1] = p_Var4;
    local_28 = (_func_int **)(p_Var4 + 8);
    for (local_30 = in_RDI[2]._vptr_CVmVarHeapHybrid_block; local_30 != (_func_int **)0x0;
        local_30 = (_func_int **)((long)local_30 + -1)) {
      *local_28 = (_func_int *)in_RDI[3]._vptr_CVmVarHeapHybrid_block;
      in_RDI[3]._vptr_CVmVarHeapHybrid_block = local_28;
      local_28 = (_func_int **)(sVar3 + (long)local_28);
    }
  }
  pCVar2 = (CVmVarHeapHybrid_hdr *)in_RDI[3]._vptr_CVmVarHeapHybrid_block;
  in_RDI[3]._vptr_CVmVarHeapHybrid_block = (_func_int **)*in_RDI[3]._vptr_CVmVarHeapHybrid_block;
  pCVar2->block = in_RDI;
  return pCVar2;
}

Assistant:

CVmVarHeapHybrid_hdr *CVmVarHeapHybrid_head::alloc(size_t)
{
    /* if there isn't an entry, allocate another array */
    if (first_free_ == 0)
    {
        CVmVarHeapHybrid_array *arr;
        size_t real_cell_size;
        char *p;
        size_t cnt;
        
        /* 
         *   Allocate another page.  We need space for the array header
         *   itself, plus space for all of the cells.  We want page_count_
         *   cells, each of size cell_size_ plus the size of the per-cell
         *   header, rounded to the worst-case alignment size for the
         *   platform.  
         */
        real_cell_size = osrndsz(cell_size_
                                 + osrndsz(sizeof(CVmVarHeapHybrid_hdr)));
        arr = (CVmVarHeapHybrid_array *)
              t3malloc(sizeof(CVmVarHeapHybrid_array)
                       + (page_count_ * real_cell_size));

        /* if that failed, throw an error */
        if (arr == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* link the array into the master list */
        arr->next_array = mem_mgr_->first_array_;
        mem_mgr_->first_array_ = arr;

        /* 
         *   Build the free list.  Each cell goes into the free list; the
         *   'next' pointer is stored in the data area of the cell. 
         */
        for (p = arr->mem, cnt = page_count_ ; cnt > 0 ;
             p += real_cell_size, --cnt)
        {
            /* link this one into the free list */
            *(void **)p = first_free_;
            first_free_ = (void *)p;
        }
    }
    
    /* remember the return value */
    CVmVarHeapHybrid_hdr *ret = (CVmVarHeapHybrid_hdr *)first_free_;

    /* 
     *   when we initialized or last freed this entry, we stored a pointer
     *   to the next item in the free list in the object's data - retrieve
     *   this pointer now, and update our free list head to point to the
     *   next item 
     */
    first_free_ = *(void **)first_free_;

    /* fill in the block's pointer to the allocating heap (i.e., this) */
    ret->block = this;

    /* return the item */
    return ret;
}